

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  ImSpan<ImGuiTableColumn> *this;
  byte bVar1;
  ImGuiContext *pIVar2;
  ImGuiTableSettings *p;
  ImGuiTableColumn *pIVar3;
  char *pcVar4;
  bool bVar5;
  ulong uVar6;
  int column_n;
  byte *pbVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  
  pIVar2 = GImGui;
  table->IsSettingsRequestLoad = false;
  if ((table->Flags & 0x10) == 0) {
    if (table->SettingsOffset == -1) {
      p = TableSettingsFindByID(table->ID);
      if (p == (ImGuiTableSettings *)0x0) {
        return;
      }
      if (table->ColumnsCount != (int)p->ColumnsCount) {
        table->IsSettingsDirty = true;
      }
      iVar9 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr(&pIVar2->SettingsTables,p);
      table->SettingsOffset = iVar9;
    }
    else {
      p = TableGetBoundSettings(table);
    }
    table->SettingsLoadedFlags = p->SaveFlags;
    table->RefScale = p->RefScale;
    this = &table->Columns;
    pbVar7 = (byte *)((long)&p[1].RefScale + 3);
    uVar10 = 0;
    for (iVar9 = 0; bVar1 = p->ColumnsCount, iVar9 < (char)bVar1; iVar9 = iVar9 + 1) {
      uVar8 = (uint)(char)pbVar7[-3];
      uVar6 = (ulong)uVar8;
      if ((-1 < (int)uVar8) && ((int)uVar8 < table->ColumnsCount)) {
        pIVar3 = ImSpan<ImGuiTableColumn>::operator[](this,uVar8);
        uVar8 = p->SaveFlags;
        if ((uVar8 & 1) != 0) {
          *(undefined4 *)((long)&pIVar3->WidthRequest + (ulong)(*pbVar7 & 8)) =
               *(undefined4 *)(pbVar7 + -0xb);
          pIVar3->AutoFitQueue = '\0';
        }
        if ((uVar8 & 2) != 0) {
          uVar6 = (ulong)pbVar7[-2];
        }
        pIVar3->DisplayOrder = (ImGuiTableColumnIdx)uVar6;
        uVar10 = uVar10 | 1L << (uVar6 & 0x3f);
        bVar5 = (bool)(*pbVar7 >> 2 & 1);
        pIVar3->IsEnabledNextFrame = bVar5;
        pIVar3->IsEnabled = bVar5;
        pIVar3->SortOrder = pbVar7[-1];
        pIVar3->field_0x64 = pIVar3->field_0x64 & 0xfc | *pbVar7 & 3;
      }
      pbVar7 = pbVar7 + 0xc;
    }
    uVar6 = ~(-1L << (bVar1 & 0x3f));
    if (bVar1 == 0x40) {
      uVar6 = 0xffffffffffffffff;
    }
    if (uVar10 != uVar6) {
      for (iVar9 = 0; iVar9 < table->ColumnsCount; iVar9 = iVar9 + 1) {
        pIVar3 = ImSpan<ImGuiTableColumn>::operator[](this,iVar9);
        pIVar3->DisplayOrder = (ImGuiTableColumnIdx)iVar9;
      }
    }
    for (iVar9 = 0; iVar9 < table->ColumnsCount; iVar9 = iVar9 + 1) {
      pIVar3 = ImSpan<ImGuiTableColumn>::operator[](this,iVar9);
      pcVar4 = ImSpan<signed_char>::operator[]
                         (&table->DisplayOrderToIndex,(int)pIVar3->DisplayOrder);
      *pcVar4 = (char)iVar9;
    }
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        if (settings->ColumnsCount != table->ColumnsCount) // Allow settings if columns count changed. We could otherwise decide to return...
            table->IsSettingsDirty = true;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }

    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    ImU64 display_order_mask = 0;
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->StretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImGuiTableColumnIdx)column_n;
        display_order_mask |= (ImU64)1 << column->DisplayOrder;
        column->IsEnabled = column->IsEnabledNextFrame = column_settings->IsEnabled;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // Validate and fix invalid display order data
    const ImU64 expected_display_order_mask = (settings->ColumnsCount == 64) ? ~0 : ((ImU64)1 << settings->ColumnsCount) - 1;
    if (display_order_mask != expected_display_order_mask)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
            table->Columns[column_n].DisplayOrder = (ImGuiTableColumnIdx)column_n;

    // Rebuild index
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
}